

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  bool local_4d;
  bool local_4c;
  typed_flags<eats_meat,_eats_grass,_has_tail> local_4b;
  typed_flags<eats_meat,_eats_grass,_has_tail> local_4a;
  flags_storage<3UL> local_49;
  flag<eats_meat> local_48;
  typed_flags<eats_meat,_eats_grass,_has_tail> local_47;
  this_type local_46;
  array<unsigned_char,_1UL> local_45 [8];
  animal a3;
  flags_storage<3ul> local_38 [32];
  typed_flags<eats_meat,eats_grass,has_tail> local_18;
  flags_storage<3UL> local_17;
  flag<has_tail> local_16;
  flag<eats_grass> local_15;
  flag<eats_meat> local_14;
  flag<eats_grass> local_13;
  flag<eats_meat> local_12;
  flag<has_tail> local_11;
  animal a2;
  animal a1;
  flag<has_tail> f3;
  flag<eats_grass> f2;
  flag<eats_meat> f1;
  animal wolf;
  
  tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::typed_flags
            ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&f2);
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_>::
  set<eats_grass>((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_> *)&f2,false
                 );
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>>::
  set<eats_meat,has_tail>
            ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>> *)&f2,true);
  tfl::flag<has_tail>::flag(&f3,true);
  tfl::flag<eats_meat>::flag((flag<eats_meat> *)&a1,true);
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>>::
  set<has_tail,eats_meat>
            ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>> *)&f2,f3,
             (flag<eats_meat>)a1.super_flags_storage<3UL>.m_data._M_elems[0]);
  tfl::flag<has_tail>::flag(&local_11,true);
  tfl::flag<eats_meat>::flag(&local_12,true);
  tfl::flag<eats_grass>::flag(&local_13,false);
  tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<has_tail,eats_meat,eats_grass>
            ((typed_flags<eats_meat,eats_grass,has_tail> *)&a2,local_11,local_12,local_13);
  f2.value = (bool)a2.super_flags_storage<3UL>.m_data._M_elems[0];
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::test<eats_meat>
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&f2);
  local_4c = false;
  if (bVar1) {
    local_4c = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::test<has_tail>
                         ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&f2);
  }
  if (local_4c == false) {
    __assert_fail("(wolf.test<eats_meat>() && wolf.test<has_tail>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/example/example.cpp"
                  ,0x25,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>>::
          all<eats_meat,has_tail>
                    ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>> *)&f2);
  if (!bVar1) {
    __assert_fail("(wolf.all<eats_meat, has_tail>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/example/example.cpp"
                  ,0x28,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,eats_grass,has_tail>::any<eats_meat,has_tail,eats_grass>
                    ((typed_flags<eats_meat,eats_grass,has_tail> *)&f2);
  if (!bVar1) {
    __assert_fail("(wolf.any<eats_meat, has_tail, eats_grass>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/example/example.cpp"
                  ,0x29,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_>::
          none<eats_grass>((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_> *)
                           &f2);
  if (!bVar1) {
    __assert_fail("(wolf.none<eats_grass>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/example/example.cpp"
                  ,0x2a,"int main()");
  }
  tfl::flag<eats_meat>::flag(&local_14);
  tfl::flag<eats_grass>::flag(&local_15);
  tfl::flag<has_tail>::flag(&local_16);
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>>::
  get<eats_meat,eats_grass>
            ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>> *)&f2,&local_14,
             &local_15);
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_>::get<has_tail>
            ((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_> *)&f2,&local_16)
  ;
  bVar1 = tfl::flag::operator_cast_to_bool((flag *)&local_14);
  local_4d = false;
  if (bVar1) {
    bVar1 = tfl::flag::operator_cast_to_bool((flag *)&local_15);
    local_4d = false;
    if (!bVar1) {
      local_4d = tfl::flag::operator_cast_to_bool((flag *)&local_16);
    }
  }
  if (local_4d == false) {
    __assert_fail("f1 && !f2 && f3",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/example/example.cpp"
                  ,0x32,"int main()");
  }
  tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::typed_flags
            ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_17,3);
  tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<char,std::char_traits<char>>
            (&local_18,"101",0xffffffffffffffff,'0','1');
  iVar2 = tfl::detail::flags_storage<3UL>::to_integral<int>(&local_17);
  if (iVar2 != 3) {
    __assert_fail("a1.to_integral<int>() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/example/example.cpp"
                  ,0x38,"int main()");
  }
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (local_38,(char)&local_18,'0');
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"101");
  if (bVar1) {
    std::__cxx11::string::~string((string *)local_38);
    local_45[0]._M_elems[0] = (_Type)(_Type)f2.value;
    tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<char,std::char_traits<char>>
              ((typed_flags<eats_meat,eats_grass,has_tail> *)&local_46,"001",0xffffffffffffffff,'0',
               '1');
    tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator&=
              ((typed_flags<eats_meat,_eats_grass,_has_tail> *)local_45,&local_46);
    tfl::flag<eats_meat>::flag(&local_48,true);
    tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::typed_flags<eats_meat>(&local_47,local_48);
    bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator==
                      ((typed_flags<eats_meat,_eats_grass,_has_tail> *)local_45,&local_47);
    if (!bVar1) {
      __assert_fail("a3 == animal{flag<eats_meat>{1}}",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/example/example.cpp"
                    ,0x3e,"int main()");
    }
    tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::typed_flags(&local_4a,2);
    local_49.m_data._M_elems[0] =
         (array<unsigned_char,_1UL>)
         tfl::operator|((typed_flags<eats_meat,_eats_grass,_has_tail> *)local_45,&local_4a);
    tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::typed_flags(&local_4b,3);
    bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator==
                      ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_49,&local_4b);
    if (bVar1) {
      return 0;
    }
    __assert_fail("(a3 | animal{2}) == animal{3}",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/example/example.cpp"
                  ,0x3f,"int main()");
  }
  __assert_fail("a2.to_string() == \"101\"",
                "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/example/example.cpp"
                ,0x39,"int main()");
}

Assistant:

int main()
{
    // unlike std::bitset typed_flags allocates less memory
    assert( sizeof(animal) == 1 );
    
    // create flags from scratch
    animal wolf;
    wolf.set<eats_grass>(false);
    wolf.set<eats_meat, has_tail>();
    wolf.set(flag<has_tail>{1}, flag<eats_meat>{1});
    
    // create flags with flexible human-readable constructor
    wolf = animal{flag<has_tail>{1}, flag<eats_meat>{1}, flag<eats_grass>{0}};
    
    // test each flag separately
    assert( (wolf.test<eats_meat>() && wolf.test<has_tail>()) );
    
    // test group off flags in one call
    assert( (wolf.all<eats_meat, has_tail>()) );
    assert( (wolf.any<eats_meat, has_tail, eats_grass>()) );
    assert( (wolf.none<eats_grass>()) );
    
    // extract flag values
    flag<eats_meat> f1;
    flag<eats_grass> f2;
    flag<has_tail> f3;
    wolf.get(f1, f2);
    wolf.get(f3);
    assert( f1 && !f2 && f3 );
    
    // like std::bitset create flags from integers or strings 
    // and convert vice versa
    auto a1 = animal{3};
    auto a2 = animal{"101"};
    assert( a1.to_integral<int>() == 3 );
    assert( a2.to_string() == "101" );
    
    // there are bitwise member and non-member functions
    auto a3 = wolf;
    a3 &= animal{"001"};
    assert( a3 == animal{flag<eats_meat>{1}} );
    assert( (a3 | animal{2}) == animal{3} );
    
    //wolf.set<build_spaceships>(); // compile error!
    //wolf = engineer{1}; // compile error!
}